

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O3

void Am_Initialize_Char_Map(void)

{
  Am_Symbol_Table *pAVar1;
  Am_Input_Event *this;
  char *name;
  mapped_type *pmVar2;
  mapped_type *ppcVar3;
  char c;
  int code;
  char *local_28;
  
  if ((char_map == (Am_Symbol_Table *)0x0) || (click_count_map == (Am_Symbol_Table *)0x0)) {
    char_map = Am_Symbol_Table::Create(0xbe);
    click_count_map = Am_Symbol_Table::Create(8);
    this = (Am_Input_Event *)operator_new(0x30);
    Am_Input_Char::Am_Input_Char
              ((Am_Input_Char *)this,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
    (this->user_id).type = 0;
    (this->user_id).value.wrapper_value = (Am_Wrapper *)0x0;
    code = 0x20;
    Am_Current_Input_Event = this;
    do {
      name = (char *)operator_new__(2);
      *name = (char)code;
      name[1] = '\0';
      set_key_map(code,name);
      code = code + 1;
    } while (code != 0x7f);
    set_key_map(0x100,"LEFT");
    set_key_map(0x101,"MIDDLE");
    set_key_map(0x102,"RIGHT");
    set_key_map(0x103,"MOUSE_MOVED");
    set_key_map(0x104,"MOUSE_ENTER_WINDOW");
    set_key_map(0x105,"MOUSE_LEAVE_WINDOW");
    set_key_map(0x106,"MOUSE");
    set_key_map(0x10a,"RUBOUT");
    set_key_map(0x7f,"DELETE");
    set_key_map(0x1b,"ESC");
    set_key_map(8,"BACKSPACE");
    set_key_map(0xd,"RETURN");
    set_key_map(10,"NEWLINE");
    set_key_map(0x20,"SPACE");
    set_key_map(10,"LINEFEED");
    set_key_map(9,"TAB");
    set_key_map(0x10b,"F1");
    set_key_map(0x10c,"F2");
    set_key_map(0x10d,"F3");
    set_key_map(0x10e,"F4");
    set_key_map(0x10f,"F5");
    set_key_map(0x110,"F6");
    set_key_map(0x111,"F7");
    set_key_map(0x112,"F8");
    set_key_map(0x113,"F9");
    set_key_map(0x114,"F10");
    set_key_map(0x115,"F11");
    set_key_map(0x116,"F12");
    set_key_map(0x117,"F13");
    set_key_map(0x118,"F14");
    set_key_map(0x119,"F15");
    set_key_map(0x11a,"F16");
    set_key_map(0x11b,"F17");
    set_key_map(0x11c,"F18");
    set_key_map(0x11d,"F19");
    set_key_map(0x11e,"F20");
    set_key_map(0x11f,"L1");
    set_key_map(0x120,"L2");
    set_key_map(0x121,"L3");
    set_key_map(0x122,"L4");
    set_key_map(0x123,"L5");
    set_key_map(0x124,"L6");
    set_key_map(0x125,"L7");
    set_key_map(0x126,"L8");
    set_key_map(0x127,"L9");
    set_key_map(0x128,"L10");
    set_key_map(0x129,"R1");
    set_key_map(0x12a,"R2");
    set_key_map(299,"R3");
    set_key_map(300,"R4");
    set_key_map(0x12d,"R5");
    set_key_map(0x12e,"R6");
    set_key_map(0x12f,"R7");
    set_key_map(0x130,"R8");
    set_key_map(0x131,"R9");
    set_key_map(0x132,"R10");
    set_key_map(0x133,"R11");
    set_key_map(0x134,"R12");
    set_key_map(0x135,"R13");
    set_key_map(0x136,"R14");
    set_key_map(0x137,"R15");
    set_key_map(0x13b,"LEFT_ARROW");
    set_key_map(0x13c,"UP_ARROW");
    set_key_map(0x13d,"DOWN_ARROW");
    set_key_map(0x13e,"RIGHT_ARROW");
    set_key_map(0x13f,"PRIOR");
    set_key_map(0x140,"NEXT");
    set_key_map(0x141,"SELECT");
    set_key_map(0x142,"MENU");
    set_key_map(0x143,"HELP");
    set_key_map(0x144,"ALT_GRAPH");
    set_key_map(0x138,"ENTER");
    set_key_map(0x139,"NUMLOCK");
    set_key_map(0x13a,"SCROLL_LOCK");
    set_key_map(0x145,"FIND");
    set_key_map(0x146,"INSERT");
    set_key_map(0x147,"REMOVE");
    set_key_map(0x148,"COMPOSE_CHARACTER");
    set_key_map(0x149,"INSERT_HERE");
    set_key_map(0x14a,"DO");
    set_key_map(0x14b,"HOME");
    set_key_map(0x14c,"BREAK");
    set_key_map(0x14d,"CANCEL");
    set_key_map(0x14e,"CLEAR");
    set_key_map(0x14f,"EXECUTE");
    set_key_map(0x150,"INSERT_CHAR");
    set_key_map(0x151,"INSERT_LINE");
    set_key_map(0x152,"DELETE_LINE");
    set_key_map(0x153,"DELETE_CHAR");
    set_key_map(0x154,"CLEAR_LINE");
    set_key_map(0x155,"USER");
    set_key_map(0x156,"PF1");
    set_key_map(0x157,"PF2");
    set_key_map(0x158,"PF3");
    set_key_map(0x159,"PF4");
    set_key_map(0x15a,"PAGE");
    set_key_map(0x15b,"PAGE_UP");
    set_key_map(0x15d,"PAGE_DOWN");
    set_key_map(0x15c,"END");
    set_key_map(0x15e,"UNDO");
    set_key_map(0x15f,"REDO");
    set_key_map(0x160,"PRINT");
    set_key_map(0x14d,"CANCEL");
    set_key_map(0x161,"CUT");
    set_key_map(0x162,"OPEN");
    set_key_map(0x163,"PASTE");
    set_key_map(0x164,"FRONT");
    set_key_map(0x165,"COPY");
    set_key_map(0x166,"PROPS");
    set_key_map(0x167,"KEYBOARD");
    pAVar1 = click_count_map;
    local_28 = "SINGLE_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 1;
    local_28 = (char *)CONCAT44(local_28._4_4_,1);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "SINGLE_";
    pAVar1 = click_count_map;
    local_28 = "DOUBLE_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 2;
    local_28 = (char *)CONCAT44(local_28._4_4_,2);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "DOUBLE_";
    pAVar1 = click_count_map;
    local_28 = "TRIPLE_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 3;
    local_28 = (char *)CONCAT44(local_28._4_4_,3);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "TRIPLE_";
    pAVar1 = click_count_map;
    local_28 = "QUAD_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 4;
    local_28 = (char *)CONCAT44(local_28._4_4_,4);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "QUAD_";
    pAVar1 = click_count_map;
    local_28 = "FIVE_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 5;
    local_28 = (char *)CONCAT44(local_28._4_4_,5);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "FIVE_";
    pAVar1 = click_count_map;
    local_28 = "MANYCLICK_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 6;
    local_28 = (char *)CONCAT44(local_28._4_4_,6);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "MANYCLICK_";
    pAVar1 = click_count_map;
    local_28 = "ANY_";
    pmVar2 = std::
             map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
             ::operator[]((map<const_char_*,_int,_lex_less<const_char_*>,_std::allocator<std::pair<const_char_*const,_int>_>_>
                           *)click_count_map,&local_28);
    *pmVar2 = 7;
    local_28 = (char *)CONCAT44(local_28._4_4_,7);
    ppcVar3 = std::
              map<int,_const_char_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_char_*>_>_>
              ::operator[](&(pAVar1->Am_Map_CInt2Str).mMap,(key_type *)&local_28);
    *ppcVar3 = "ANY_";
    Am_Init_Key_Map();
  }
  return;
}

Assistant:

void
Am_Initialize_Char_Map()
{
  if (char_map != nullptr && click_count_map != nullptr)
    return;

  // allocate hash tables
  char_map = Am_Symbol_Table::Create(190);
  click_count_map = Am_Symbol_Table::Create(8);

  // allocate current event record
  Am_Current_Input_Event = new Am_Input_Event;

  // printable characters
  for (char c = ' '; c <= '~'; ++c)
    set_key_map(c, alloc_string_for(c));

  // special characters
  set_key_map(Am_LEFT_MOUSE, "LEFT");
  set_key_map(Am_MIDDLE_MOUSE, "MIDDLE");
  set_key_map(Am_RIGHT_MOUSE, "RIGHT");
  set_key_map(Am_MOUSE_MOVED, "MOUSE_MOVED");
  set_key_map(Am_MOUSE_ENTER_WINDOW, "MOUSE_ENTER_WINDOW");
  set_key_map(Am_MOUSE_LEAVE_WINDOW, "MOUSE_LEAVE_WINDOW");
  set_key_map(Am_ANY_MOUSE, "MOUSE"); // used for "ANY_MOUSE_DOWN"

  //standard characters
  set_key_map(Am_RUBOUT, "RUBOUT");
  set_key_map(Am_DELETE, "DELETE");
  set_key_map(Am_ESC, "ESC");
  set_key_map(Am_BACKSPACE, "BACKSPACE");
  set_key_map(Am_RETURN, "RETURN");
  set_key_map(Am_NEWLINE, "NEWLINE");
  set_key_map(Am_SPACE, "SPACE");
  set_key_map(Am_LINEFEED, "LINEFEED");
  set_key_map(Am_TAB, "TAB");

  //function keys
  set_key_map(Am_F1, "F1");
  set_key_map(Am_F2, "F2");
  set_key_map(Am_F3, "F3");
  set_key_map(Am_F4, "F4");
  set_key_map(Am_F5, "F5");
  set_key_map(Am_F6, "F6");
  set_key_map(Am_F7, "F7");
  set_key_map(Am_F8, "F8");
  set_key_map(Am_F9, "F9");
  set_key_map(Am_F10, "F10");
  set_key_map(Am_F11, "F11");
  set_key_map(Am_F12, "F12");
  set_key_map(Am_F13, "F13");
  set_key_map(Am_F14, "F14");
  set_key_map(Am_F15, "F15");
  set_key_map(Am_F16, "F16");
  set_key_map(Am_F17, "F17");
  set_key_map(Am_F18, "F18");
  set_key_map(Am_F19, "F19");
  set_key_map(Am_F20, "F20");

  set_key_map(Am_L1, "L1");
  set_key_map(Am_L2, "L2");
  set_key_map(Am_L3, "L3");
  set_key_map(Am_L4, "L4");
  set_key_map(Am_L5, "L5");
  set_key_map(Am_L6, "L6");
  set_key_map(Am_L7, "L7");
  set_key_map(Am_L8, "L8");
  set_key_map(Am_L9, "L9");
  set_key_map(Am_L10, "L10");

  set_key_map(Am_R1, "R1");
  set_key_map(Am_R2, "R2");
  set_key_map(Am_R3, "R3");
  set_key_map(Am_R4, "R4");
  set_key_map(Am_R5, "R5");
  set_key_map(Am_R6, "R6");
  set_key_map(Am_R7, "R7");
  set_key_map(Am_R8, "R8");
  set_key_map(Am_R9, "R9");
  set_key_map(Am_R10, "R10");
  set_key_map(Am_R11, "R11");
  set_key_map(Am_R12, "R12");
  set_key_map(Am_R13, "R13");
  set_key_map(Am_R14, "R14");
  set_key_map(Am_R15, "R15");

  set_key_map(Am_LEFT_ARROW, "LEFT_ARROW");
  set_key_map(Am_UP_ARROW, "UP_ARROW");
  set_key_map(Am_DOWN_ARROW, "DOWN_ARROW");
  set_key_map(Am_RIGHT_ARROW, "RIGHT_ARROW");

  //various SUN keyboards
  set_key_map(Am_PRIOR, "PRIOR");
  set_key_map(Am_NEXT, "NEXT");
  set_key_map(Am_SELECT, "SELECT");
  set_key_map(Am_MENU, "MENU");
  set_key_map(Am_HELP, "HELP");
  set_key_map(Am_ALT_GRAPH, "ALT_GRAPH");
  set_key_map(Am_ENTER, "ENTER");
  set_key_map(Am_NUMLOCK, "NUMLOCK");
  set_key_map(Am_SCROLL_LOCK, "SCROLL_LOCK");

  //vax and dec3100 and dec5000 keyboards
  set_key_map(Am_FIND, "FIND");
  set_key_map(Am_INSERT, "INSERT");
  set_key_map(Am_REMOVE, "REMOVE");
  set_key_map(Am_COMPOSE_CHARACTER, "COMPOSE_CHARACTER");
  set_key_map(Am_INSERT_HERE, "INSERT_HERE");
  set_key_map(Am_DO_KEY, "DO");

  //hp-ux and hp9000-300 keyboards
  set_key_map(Am_HOME, "HOME");
  set_key_map(Am_BREAK, "BREAK");
  set_key_map(Am_CANCEL, "CANCEL");
  set_key_map(Am_CLEAR, "CLEAR");
  set_key_map(Am_EXECUTE, "EXECUTE");
  set_key_map(Am_INSERT_CHAR, "INSERT_CHAR");
  set_key_map(Am_INSERT_LINE, "INSERT_LINE");
  set_key_map(Am_DELETE_LINE, "DELETE_LINE");
  set_key_map(Am_DELETE_CHAR, "DELETE_CHAR");
  set_key_map(Am_CLEAR_LINE, "CLEAR_LINE");
  set_key_map(Am_USER, "USER");

  set_key_map(Am_PF1, "PF1");
  set_key_map(Am_PF2, "PF2");
  set_key_map(Am_PF3, "PF3");
  set_key_map(Am_PF4, "PF4");

  // Mac keyboard
  set_key_map(Am_PAGE, "PAGE");
  set_key_map(Am_PAGE_UP, "PAGE_UP");
  set_key_map(Am_PAGE_DOWN, "PAGE_DOWN");
  set_key_map(Am_END, "END");
  set_key_map(Am_UNDO_KEY, "UNDO");
  set_key_map(Am_REDO_KEY, "REDO");
  set_key_map(Am_PRINT_KEY, "PRINT");
  set_key_map(Am_CANCEL, "CANCEL");

  set_key_map(Am_CUT_KEY, "CUT");
  set_key_map(Am_OPEN_KEY, "OPEN");
  set_key_map(Am_PASTE_KEY, "PASTE");
  set_key_map(Am_FRONT_KEY, "FRONT");
  set_key_map(Am_COPY_KEY, "COPY");
  set_key_map(Am_PROPS_KEY, "PROPS");

  set_key_map(Am_ANY_KEYBOARD, "KEYBOARD"); // used for ANY_KEYBOARD

  click_count_map->Add_Item(Am_SINGLE_CLICK, "SINGLE_");
  click_count_map->Add_Item(Am_DOUBLE_CLICK, "DOUBLE_");
  click_count_map->Add_Item(Am_TRIPLE_CLICK, "TRIPLE_");
  click_count_map->Add_Item(Am_QUAD_CLICK, "QUAD_");
  click_count_map->Add_Item(Am_FIVE_CLICK, "FIVE_");
  click_count_map->Add_Item(Am_MANY_CLICK, "MANYCLICK_");
  click_count_map->Add_Item(Am_ANY_CLICK, "ANY_");

  Am_Init_Key_Map(); // initialize keysym mapping
}